

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroAbs
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  element_type *peVar1;
  undefined4 in_register_0000000c;
  char *pcVar2;
  uint in_R8D;
  long lVar3;
  long *plVar4;
  initializer_list<AssemblyTemplateArgument> variables;
  string sraop;
  string subop;
  string macroText;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined1 *local_110;
  char *local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  string local_f0;
  char *local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  char *local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  char *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_130 = &local_120;
  local_128 = 0;
  local_120 = 0;
  local_108 = (char *)0x0;
  local_100 = 0;
  local_110 = &local_100;
  if ((in_R8D & 0xf) == 7) {
    std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)0x0,0x193489);
    pcVar2 = "dsubu";
  }
  else {
    if ((in_R8D & 0xf) != 5) {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_001827d2;
    }
    std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)0x0,0x19469e);
    pcVar2 = "subu";
  }
  std::__cxx11::string::_M_replace((ulong)&local_110,0,local_108,(ulong)pcVar2);
  preprocessMacro_abi_cxx11_
            (&local_f0,
             "\n\t\t%sraop% \tr1,%rs%,31\n\t\txor \t\t%rd%,%rs%,r1\n\t\t%subop% \t%rd%,%rd%,r1\n\t",
             (MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_d0 = "%rd%";
  local_c8[0] = local_b8;
  lVar3 = *(long *)&immediates[1].primary.expression.constExpression;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,lVar3,*(long *)&immediates[1].primary.value + lVar3);
  local_a8 = "%rs%";
  local_a0[0] = local_90;
  peVar1 = (immediates->primary).expression.expression.
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,peVar1,
             (long)&((immediates->primary).expression.expression.
                     super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + (long)peVar1);
  local_80 = "%sraop%";
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_130,local_130 + local_128);
  local_58 = "%subop%";
  plVar4 = local_40;
  local_50[0] = plVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_110,local_108 + (long)local_110);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_d0;
  createMacro(parser,(string *)registers,(int)&local_f0,variables);
  lVar3 = -0xa0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
LAB_001827d2:
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroAbs(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateAbs = R"(
		%sraop% 	r1,%rs%,31
		xor 		%rd%,%rs%,r1
		%subop% 	%rd%,%rd%,r1
	)";

	std::string sraop, subop;

	switch (flags & MIPSM_ACCESSMASK)
	{
	case MIPSM_W:	sraop = "sra"; subop = "subu"; break;
	case MIPSM_DW:	sraop = "dsra32"; subop = "dsubu"; break;
	default: return nullptr;
	}

	std::string macroText = preprocessMacro(templateAbs,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%rd%",		registers.grd.name.string() },
			{ "%rs%",		registers.grs.name.string() },
			{ "%sraop%",	sraop },
			{ "%subop%",	subop },
	});
}